

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

bool glcts::verifyFace<float,4u,3u,3u>
               (float *data,GLuint cube_face,float *expected_values,GLuint image_width)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  
  uVar3 = cube_face * 0xc;
  uVar2 = cube_face * 0x24;
  bVar8 = false;
  uVar4 = 0;
  do {
    lVar1 = 0;
    uVar5 = uVar3;
    uVar6 = uVar2;
    do {
      lVar7 = 0;
      do {
        if (data[(ulong)uVar5 + lVar7] != expected_values[(ulong)uVar6 + lVar7]) {
          return bVar8;
        }
        if (NAN(data[(ulong)uVar5 + lVar7]) || NAN(expected_values[(ulong)uVar6 + lVar7])) {
          return bVar8;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar1 = lVar1 + 1;
      uVar6 = uVar6 + 4;
      uVar5 = uVar5 + 4;
    } while (lVar1 != 3);
    bVar8 = 1 < uVar4;
    uVar4 = uVar4 + 1;
    uVar2 = uVar2 + 0xc;
    uVar3 = uVar3 + image_width * 4;
    if (uVar4 == 3) {
      return true;
    }
  } while( true );
}

Assistant:

bool verifyFace(const T* data, const glw::GLuint cube_face, const T* expected_values, const glw::GLuint image_width)
{
	static const glw::GLuint size_of_pixel = N_Components;

	const glw::GLuint data_face_offset  = N_Components * Width * cube_face;
	const glw::GLuint exp_face_offset   = N_Components * Width * Height * cube_face;
	const glw::GLuint data_size_of_line = image_width * size_of_pixel;
	const glw::GLuint exp_size_of_line  = Width * size_of_pixel;

	for (glw::GLuint y = 0; y < Height; ++y)
	{
		const glw::GLuint data_line_offset = y * data_size_of_line;
		const glw::GLuint exp_line_offset  = y * exp_size_of_line;

		for (glw::GLuint x = 0; x < Width; ++x)
		{
			const glw::GLuint data_pixel_offset = data_line_offset + data_face_offset + x * size_of_pixel;
			const glw::GLuint exp_pixel_offset  = exp_line_offset + exp_face_offset + x * size_of_pixel;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (data[data_pixel_offset + component] != expected_values[exp_pixel_offset + component])
				{
					return false;
				}
			}
		}
	}

	return true;
}